

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAndRgEa<(moira::Instr)9,(moira::Mode)8,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  u32 result;
  uint val;
  
  addr = computeEA<(moira::Mode)8,(moira::Size)1,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,addr);
  val = *(byte *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58) & uVar1;
  (this->reg).sr.n = 0x7f < val;
  (this->reg).sr.z = val == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,addr,val);
  return;
}

Assistant:

void
Moira::execAndRgEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    u32 result = logic<I,S>(readD<S>(src), data);
    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(4);
    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}